

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

string * format<int,char*>(string *__return_storage_ptr__,int fmt_num,string *fmt,int arg,char *args
                          )

{
  undefined1 local_50 [8];
  string fmt_replaced;
  char *args_local;
  int arg_local;
  string *fmt_local;
  int fmt_num_local;
  
  fmt_replaced.field_2._8_8_ = args;
  format<int>((string *)local_50,fmt_num,fmt,arg);
  format<char*>(__return_storage_ptr__,fmt_num + 1,(string *)local_50,
                (char *)fmt_replaced.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (int fmt_num, const std::string& fmt, T arg, Args... args)
{
    const std::string fmt_replaced (format (fmt_num, fmt, arg));
    return format (fmt_num+1, fmt_replaced, args...);
}